

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

InternalParseResult * __thiscall
Catch::clara::detail::Arg::parse
          (InternalParseResult *__return_storage_ptr__,Arg *this,string *param_1,TokenStream *tokens
          )

{
  element_type *peVar1;
  int iVar2;
  Token *pTVar3;
  TokenStream *pTVar4;
  ParserResult result;
  TokenStream remainingTokens;
  Result validationResult;
  ParseState local_100;
  TokenStream local_d0;
  undefined1 local_a8 [40];
  ParseState local_80;
  BasicResult<void> local_50;
  
  (*(this->super_ParserRefImpl<Catch::clara::detail::Arg>).
    super_ComposableParserImpl<Catch::clara::detail::Arg>.super_ParserBase._vptr_ParserBase[2])
            (&local_50);
  if (local_50.super_ResultValueBase<void>.super_ResultBase.m_type == Ok) {
    TokenStream::TokenStream(&local_d0,tokens);
    TokenStream::operator*((Token *)local_a8,&local_d0);
    if (local_a8._0_4_ == Argument) {
      iVar2 = (*((this->super_ParserRefImpl<Catch::clara::detail::Arg>).m_ref.
                 super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_BoundRef[3])();
      if ((char)iVar2 != '\0') {
        __assert_fail("!m_ref->isFlag()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/olivermichel[P]libom2/test/include/catch.h"
                      ,0x248c,
                      "virtual InternalParseResult Catch::clara::detail::Arg::parse(const std::string &, const TokenStream &) const"
                     );
      }
      peVar1 = (this->super_ParserRefImpl<Catch::clara::detail::Arg>).m_ref.
               super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      pTVar3 = TokenStream::operator->(&local_d0);
      (*peVar1->_vptr_BoundRef[4])(&local_100,peVar1,&pTVar3->token);
      if ((int)local_100.m_remainingTokens.it._M_current == 0) {
        pTVar4 = TokenStream::operator++(&local_d0);
        local_80.m_type = Matched;
        TokenStream::TokenStream(&local_80.m_remainingTokens,pTVar4);
        BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                  (__return_storage_ptr__,&local_80);
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        ~vector(&local_80.m_remainingTokens.m_tokenBuffer);
      }
      else {
        BasicResult<Catch::clara::detail::ParseState>::
        BasicResult<Catch::clara::detail::ParseResultType>
                  (__return_storage_ptr__,
                   (BasicResult<Catch::clara::detail::ParseResultType> *)&local_100);
      }
      BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult
                ((BasicResult<Catch::clara::detail::ParseResultType> *)&local_100);
    }
    else {
      local_100.m_type = NoMatch;
      TokenStream::TokenStream(&local_100.m_remainingTokens,&local_d0);
      BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                (__return_storage_ptr__,&local_100);
      std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
      ~vector(&local_100.m_remainingTokens.m_tokenBuffer);
    }
    ::std::__cxx11::string::~string((string *)(local_a8 + 8));
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              (&local_d0.m_tokenBuffer);
  }
  else {
    BasicResult<Catch::clara::detail::ParseState>::BasicResult<void>
              (__return_storage_ptr__,&local_50);
  }
  BasicResult<void>::~BasicResult(&local_50);
  return __return_storage_ptr__;
}

Assistant:

auto parse( std::string const &, TokenStream const &tokens ) const -> InternalParseResult override {
            auto validationResult = validate();
            if( !validationResult )
                return InternalParseResult( validationResult );

            auto remainingTokens = tokens;
            auto const &token = *remainingTokens;
            if( token.type != TokenType::Argument )
                return InternalParseResult::ok( ParseState( ParseResultType::NoMatch, remainingTokens ) );

            assert( !m_ref->isFlag() );
            auto valueRef = static_cast<detail::BoundValueRefBase*>( m_ref.get() );

            auto result = valueRef->setValue( remainingTokens->token );
            if( !result )
                return InternalParseResult( result );
            else
                return InternalParseResult::ok( ParseState( ParseResultType::Matched, ++remainingTokens ) );
        }